

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_estimateSubBlockSize_symbolType
                 (symbolEncodingType_e type,BYTE *codeTable,uint maxCode,size_t nbSeq,
                 FSE_CTable *fseCTable,U8 *additionalBits,short *defaultNorm,U32 defaultNormLog,
                 U32 defaultMax,void *workspace,size_t wkspSize)

{
  size_t sVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint max;
  uint local_34;
  
  local_34 = maxCode;
  HIST_countFast_wksp((uint *)workspace,&local_34,codeTable,nbSeq,workspace,0x22d8);
  if (type != set_rle) {
    if (type == set_basic) {
      if (defaultMax < local_34) {
        __assert_fail("max <= defaultMax",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4e52,
                      "size_t ZSTD_estimateSubBlockSize_symbolType(symbolEncodingType_e, const BYTE *, unsigned int, size_t, const FSE_CTable *, const U8 *, const short *, U32, U32, void *, size_t)"
                     );
      }
      sVar1 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,(uint *)workspace,local_34);
      goto LAB_001a8b8d;
    }
    if ((type & ~set_rle) == set_compressed) {
      sVar1 = ZSTD_fseBitCost(fseCTable,(uint *)workspace,local_34);
      if (0xffffffffffffff88 < sVar1) {
        return nbSeq * 10;
      }
      goto LAB_001a8b8d;
    }
  }
  sVar1 = 0;
LAB_001a8b8d:
  if (0 < (long)nbSeq) {
    pbVar3 = codeTable + nbSeq;
    do {
      pbVar2 = codeTable;
      if (additionalBits != (U8 *)0x0) {
        pbVar2 = additionalBits + *codeTable;
      }
      sVar1 = sVar1 + *pbVar2;
      codeTable = codeTable + 1;
    } while (codeTable < pbVar3);
  }
  return sVar1 >> 3;
}

Assistant:

static size_t ZSTD_estimateSubBlockSize_symbolType(symbolEncodingType_e type,
                        const BYTE* codeTable, unsigned maxCode,
                        size_t nbSeq, const FSE_CTable* fseCTable,
                        const U8* additionalBits,
                        short const* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                        void* workspace, size_t wkspSize)
{
    unsigned* const countWksp = (unsigned*)workspace;
    const BYTE* ctp = codeTable;
    const BYTE* const ctStart = ctp;
    const BYTE* const ctEnd = ctStart + nbSeq;
    size_t cSymbolTypeSizeEstimateInBits = 0;
    unsigned max = maxCode;

    HIST_countFast_wksp(countWksp, &max, codeTable, nbSeq, workspace, wkspSize);  /* can't fail */
    if (type == set_basic) {
        /* We selected this encoding type, so it must be valid. */
        assert(max <= defaultMax);
        cSymbolTypeSizeEstimateInBits = max <= defaultMax
                ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, countWksp, max)
                : ERROR(GENERIC);
    } else if (type == set_rle) {
        cSymbolTypeSizeEstimateInBits = 0;
    } else if (type == set_compressed || type == set_repeat) {
        cSymbolTypeSizeEstimateInBits = ZSTD_fseBitCost(fseCTable, countWksp, max);
    }
    if (ZSTD_isError(cSymbolTypeSizeEstimateInBits)) return nbSeq * 10;
    while (ctp < ctEnd) {
        if (additionalBits) cSymbolTypeSizeEstimateInBits += additionalBits[*ctp];
        else cSymbolTypeSizeEstimateInBits += *ctp; /* for offset, offset code is also the number of additional bits */
        ctp++;
    }
    return cSymbolTypeSizeEstimateInBits / 8;
}